

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

TRexBool trex_searchrange(TRex *exp,char *text_begin,char *text_end,char **out_begin,char **out_end)

{
  char *pcVar1;
  TRexBool TVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  
  if (text_end <= text_begin) {
    return 0;
  }
  iVar4 = exp->_first;
  exp->_bol = text_begin;
  exp->_eol = text_end;
  pcVar1 = text_begin;
LAB_0010659c:
  do {
    pcVar5 = pcVar1;
    pcVar3 = text_begin;
    if (iVar4 != -1) {
      exp->_currsubexp = 0;
      text_begin = trex_matchnode(exp,exp->_nodes + iVar4,text_begin,(TRexNode *)0x0);
      pcVar3 = (char *)0x0;
      if (text_begin != (char *)0x0) {
        iVar4 = exp->_nodes[iVar4].next;
        pcVar1 = pcVar5;
        goto LAB_0010659c;
      }
    }
    if ((pcVar3 != (char *)0x0) ||
       (text_begin = pcVar5 + 1, pcVar1 = text_begin, text_begin == text_end)) {
      if (pcVar3 == (char *)0x0) {
        TVar2 = 0;
      }
      else {
        if (out_begin != (char **)0x0) {
          *out_begin = pcVar5;
        }
        TVar2 = 1;
        if (out_end != (char **)0x0) {
          *out_end = pcVar3;
        }
      }
      return TVar2;
    }
  } while( true );
}

Assistant:

TRexBool trex_searchrange(TRex * exp, const TRexChar * text_begin, const TRexChar * text_end, const TRexChar ** out_begin, const TRexChar ** out_end) {
	const TRexChar * cur = NULL;
	int node = exp->_first;

	if (text_begin >= text_end) {
		return TRex_False;
	}

	exp->_bol = text_begin;
	exp->_eol = text_end;

	do {
		cur = text_begin;

		while (node != -1) {
			exp->_currsubexp = 0;
			cur = trex_matchnode(exp, &exp->_nodes[node], cur, NULL);

			if (!cur) {
				break;
			}

			node = exp->_nodes[node].next;
		}

		text_begin++;
	} while (cur == NULL && text_begin != text_end);

	if (cur == NULL) {
		return TRex_False;
	}

	--text_begin;

	if (out_begin) {
		*out_begin = text_begin;
	}

	if (out_end) {
		*out_end = cur;
	}

	return TRex_True;
}